

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O1

void searchCurrencyName(CurrencyNameStruct *currencyNames,int32_t total_currency_count,UChar *text,
                       int32_t textLen,int32_t *partialMatchLen,int32_t *maxMatchLen,
                       int32_t *maxMatchIndex)

{
  ulong uVar1;
  UChar UVar2;
  UChar *pUVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  int unaff_EBX;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  
  *maxMatchIndex = -1;
  *maxMatchLen = 0;
  iVar15 = total_currency_count + -1;
  uVar5 = 0;
  if (0 < textLen) {
    uVar5 = (ulong)(uint)textLen;
  }
  iVar9 = 0;
  uVar11 = 0;
  do {
    if (uVar11 == uVar5) {
      return;
    }
    UVar2 = text[uVar11];
    uVar1 = uVar11 + 1;
    iVar14 = iVar15;
    iVar13 = iVar9;
    do {
      if (iVar14 < iVar13) {
        iVar9 = -1;
        iVar15 = -1;
        unaff_EBX = -1;
        break;
      }
      iVar12 = (iVar13 + iVar14) / 2;
      if (((long)uVar11 < (long)currencyNames[iVar12].currencyNameLen) &&
         ((ushort)UVar2 <= (ushort)currencyNames[iVar12].currencyName[uVar11])) {
        if ((ushort)UVar2 < (ushort)currencyNames[iVar12].currencyName[uVar11]) {
          iVar14 = iVar12 + -1;
          bVar4 = true;
        }
        else {
          iVar7 = iVar12;
          if (iVar9 < iVar12) {
            do {
              iVar8 = (iVar9 + iVar7) / 2;
              if (((long)currencyNames[iVar8].currencyNameLen <= (long)uVar11) ||
                 ((ushort)currencyNames[iVar8].currencyName[uVar11] < (ushort)UVar2)) {
                iVar9 = iVar8 + 1;
                iVar8 = iVar7;
              }
              iVar7 = iVar8;
            } while (iVar9 < iVar8);
          }
          while (iVar7 = iVar15, iVar12 < iVar7) {
            iVar15 = (iVar12 + iVar7) / 2;
            if (((long)currencyNames[iVar15].currencyNameLen < (long)uVar11) ||
               ((ushort)currencyNames[iVar15].currencyName[uVar11] <= (ushort)UVar2)) {
              iVar12 = iVar15 + 1;
              iVar15 = iVar7;
            }
          }
          iVar15 = iVar7 - (uint)((ushort)UVar2 < (ushort)currencyNames[iVar7].currencyName[uVar11])
          ;
          unaff_EBX = iVar9;
          if (uVar1 != (uint)currencyNames[iVar9].currencyNameLen) {
            unaff_EBX = -1;
          }
          bVar4 = false;
        }
      }
      else {
        iVar13 = iVar12 + 1;
        bVar4 = true;
      }
    } while (bVar4);
    if (iVar9 == -1) {
      return;
    }
    iVar14 = (int)uVar1;
    if ((long)uVar11 < (long)*partialMatchLen) {
      iVar14 = *partialMatchLen;
    }
    *partialMatchLen = iVar14;
    if (unaff_EBX != -1) {
      *maxMatchLen = (int)uVar1;
      *maxMatchIndex = unaff_EBX;
    }
    uVar11 = uVar1;
  } while (9 < iVar15 - iVar9);
  if (iVar9 <= iVar15) {
    iVar14 = *partialMatchLen;
    lVar10 = (long)iVar9;
    do {
      iVar9 = currencyNames[lVar10].currencyNameLen;
      if (((textLen < iVar9) || (iVar9 <= *maxMatchLen)) ||
         (iVar13 = bcmp(currencyNames[lVar10].currencyName,text,(long)iVar9 * 2), iVar13 != 0)) {
        if (textLen <= iVar9) {
          iVar9 = textLen;
        }
        if (iVar14 < iVar9) {
          pUVar3 = currencyNames[lVar10].currencyName;
          lVar6 = (long)iVar14;
          iVar13 = iVar14;
          do {
            iVar13 = iVar13 + 1;
            if (pUVar3[lVar6] != text[lVar6]) break;
            iVar12 = iVar13;
            if (lVar6 < *partialMatchLen) {
              iVar12 = *partialMatchLen;
            }
            lVar6 = lVar6 + 1;
            *partialMatchLen = iVar12;
          } while ((1 - iVar9) + iVar13 != 1);
        }
      }
      else {
        iVar13 = *partialMatchLen;
        if (*partialMatchLen <= iVar9) {
          iVar13 = iVar9;
        }
        *partialMatchLen = iVar13;
        *maxMatchIndex = (int32_t)lVar10;
        *maxMatchLen = iVar9;
      }
      lVar10 = lVar10 + 1;
    } while (iVar15 + 1 != (int)lVar10);
  }
  return;
}

Assistant:

static void
searchCurrencyName(const CurrencyNameStruct* currencyNames, 
                   int32_t total_currency_count,
                   const UChar* text, int32_t textLen,
                   int32_t *partialMatchLen,
                   int32_t* maxMatchLen, int32_t* maxMatchIndex) {
    *maxMatchIndex = -1;
    *maxMatchLen = 0;
    int32_t matchIndex = -1;
    int32_t binarySearchBegin = 0;
    int32_t binarySearchEnd = total_currency_count - 1;
    // It is a variant of binary search.
    // For example, given the currency names in currencyNames array are:
    // A AB ABC AD AZ B BB BBEX BBEXYZ BS C D E....
    // and the input text is BBEXST
    // The first round binary search search "B" in the text against
    // the first char in currency names, and find the first char matching range
    // to be "B BB BBEX BBEXYZ BS" (and the maximum matching "B").
    // The 2nd round binary search search the second "B" in the text against
    // the 2nd char in currency names, and narrow the matching range to
    // "BB BBEX BBEXYZ" (and the maximum matching "BB").
    // The 3rd round returnes the range as "BBEX BBEXYZ" (without changing
    // maximum matching).
    // The 4th round returns the same range (the maximum matching is "BBEX").
    // The 5th round returns no matching range.
    for (int32_t index = 0; index < textLen; ++index) {
        // matchIndex saves the one with exact match till the current point.
        // [binarySearchBegin, binarySearchEnd] saves the matching range.
        matchIndex = binarySearch(currencyNames, index,
                                  text[index],
                                  &binarySearchBegin, &binarySearchEnd);
        if (binarySearchBegin == -1) { // did not find the range
            break;
        }
        *partialMatchLen = MAX(*partialMatchLen, index + 1);
        if (matchIndex != -1) { 
            // find an exact match for text from text[0] to text[index] 
            // in currencyNames array.
            *maxMatchLen = index + 1;
            *maxMatchIndex = matchIndex;
        }
        if (binarySearchEnd - binarySearchBegin < LINEAR_SEARCH_THRESHOLD) {
            // linear search if within threshold.
            linearSearch(currencyNames, binarySearchBegin, binarySearchEnd,
                         text, textLen,
                         partialMatchLen,
                         maxMatchLen, maxMatchIndex);
            break;
        }
    }
    return;
}